

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePresetsGraphReadJSONWorkflowPresets.cxx
# Opt level: O2

ReadFileResult anon_unknown.dwarf_5d6bc8::WorkflowStepTypeHelper(Type *out,Value *value)

{
  bool bVar1;
  Type TVar2;
  ReadFileResult RVar3;
  String SStack_48;
  
  RVar3 = INVALID_PRESET;
  if ((value != (Value *)0x0) && (bVar1 = Json::Value::isString(value), bVar1)) {
    Json::Value::asString_abi_cxx11_(&SStack_48,value);
    bVar1 = std::operator==(&SStack_48,"configure");
    std::__cxx11::string::~string((string *)&SStack_48);
    TVar2 = Configure;
    if (!bVar1) {
      Json::Value::asString_abi_cxx11_(&SStack_48,value);
      bVar1 = std::operator==(&SStack_48,"build");
      std::__cxx11::string::~string((string *)&SStack_48);
      if (bVar1) {
        TVar2 = Build;
      }
      else {
        Json::Value::asString_abi_cxx11_(&SStack_48,value);
        bVar1 = std::operator==(&SStack_48,"test");
        std::__cxx11::string::~string((string *)&SStack_48);
        if (bVar1) {
          TVar2 = Test;
        }
        else {
          Json::Value::asString_abi_cxx11_(&SStack_48,value);
          bVar1 = std::operator==(&SStack_48,"package");
          std::__cxx11::string::~string((string *)&SStack_48);
          if (!bVar1) {
            return INVALID_PRESET;
          }
          TVar2 = Package;
        }
      }
    }
    *out = TVar2;
    RVar3 = READ_OK;
  }
  return RVar3;
}

Assistant:

ReadFileResult WorkflowStepTypeHelper(WorkflowPreset::WorkflowStep::Type& out,
                                      const Json::Value* value)
{
  if (!value) {
    return ReadFileResult::INVALID_PRESET;
  }

  if (!value->isString()) {
    return ReadFileResult::INVALID_PRESET;
  }

  if (value->asString() == "configure") {
    out = WorkflowPreset::WorkflowStep::Type::Configure;
    return ReadFileResult::READ_OK;
  }

  if (value->asString() == "build") {
    out = WorkflowPreset::WorkflowStep::Type::Build;
    return ReadFileResult::READ_OK;
  }

  if (value->asString() == "test") {
    out = WorkflowPreset::WorkflowStep::Type::Test;
    return ReadFileResult::READ_OK;
  }

  if (value->asString() == "package") {
    out = WorkflowPreset::WorkflowStep::Type::Package;
    return ReadFileResult::READ_OK;
  }

  return ReadFileResult::INVALID_PRESET;
}